

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.hpp
# Opt level: O1

notes_iterator __thiscall
OPNMIDIplay::MIDIchannel::find_or_create_activenote(MIDIchannel *this,uint note)

{
  pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *ppVar1;
  notes_iterator nVar2;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *ppVar3;
  NoteInfo ni;
  NoteInfo local_80;
  
  ppVar1 = &(this->activenotes).endcell_;
  ppVar3 = (this->activenotes).first_;
  while ((nVar2.cell_ = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)ppVar1,
         ppVar3 != (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)ppVar1 &&
         (nVar2.cell_ = ppVar3, (ppVar3->value).note != note))) {
    ppVar3 = (ppVar3->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next;
  }
  if (((nVar2.cell_)->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next ==
      (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0) {
    local_80.note = (uint8_t)note;
    nVar2.cell_ = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)
                  pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::insert
                            (&this->activenotes,(iterator)&(this->activenotes).endcell_,&local_80);
  }
  else {
    if (((nVar2.cell_)->value).glideRate < INFINITY) {
      this->gliding_note_count = this->gliding_note_count - 1;
    }
    if (0.0 < ((nVar2.cell_)->value).ttl) {
      this->extended_note_count = this->extended_note_count - 1;
    }
  }
  return (notes_iterator)nVar2.cell_;
}

Assistant:

notes_iterator find_or_create_activenote(unsigned note)
        {
            notes_iterator it = find_activenote(note);
            if(!it.is_end())
                cleanupNote(it);
            else
            {
                NoteInfo ni;
                ni.note = note;
                it = activenotes.insert(activenotes.end(), ni);
            }
            return it;
        }